

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_bfins_32_di(void)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  sbyte sVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
    return;
  }
  uVar3 = m68ki_read_imm_16();
  iVar1 = *(int *)((long)m68ki_cpu.dar + (ulong)(uVar3 >> 10 & 0x1c));
  uVar5 = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  uVar4 = m68ki_read_imm_16();
  if ((uVar3 >> 0xb & 1) == 0) {
    uVar10 = uVar3 >> 6 & 0x1f;
  }
  else {
    uVar10 = m68ki_cpu.dar[uVar3 >> 6 & 7];
  }
  if ((uVar3 & 0x20) != 0) {
    uVar3 = m68ki_cpu.dar[uVar3 & 7];
  }
  uVar4 = (int)(short)uVar4 + uVar5 + (int)uVar10 / 8 + -1 +
          (uint)((uVar10 & 0x80000007) < 0x80000001);
  uVar9 = uVar3 - 1 & 0x1f;
  bVar2 = (byte)uVar9 ^ 0x1f;
  uVar8 = -1 << bVar2;
  sVar6 = (sbyte)(uVar10 & 7);
  uVar7 = iVar1 << bVar2;
  m68ki_cpu.n_flag = uVar7 >> 0x18;
  m68ki_cpu.not_z_flag = uVar7;
  uVar5 = m68ki_read_32_fc(uVar4,m68ki_address_space | m68ki_cpu.s_flag);
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  m68ki_write_32_fc(uVar4,m68ki_cpu.s_flag | 1,~(uVar8 >> sVar6) & uVar5 | uVar7 >> sVar6);
  if (0x20 < (uVar10 & 7) + uVar9 + 1) {
    uVar8 = uVar8 & 0xff;
    uVar5 = m68ki_read_8_fc(uVar4 + 4,m68ki_address_space | m68ki_cpu.s_flag);
    m68ki_cpu.not_z_flag = m68ki_cpu.not_z_flag | uVar5 & uVar8;
    m68ki_write_8_fc(uVar4 + 4,m68ki_cpu.s_flag | 1,~uVar8 & uVar5 | uVar7 & 0xff);
    return;
  }
  return;
}

Assistant:

static void m68k_op_bfins_32_di(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		sint offset = (word2>>6)&31;
		uint width = word2;
		uint insert_base = REG_D[(word2>>12)&7];
		uint insert_long;
		uint insert_byte;
		uint mask_base;
		uint data_long;
		uint mask_long;
		uint data_byte = 0;
		uint mask_byte = 0;
		uint ea = EA_AY_DI_8();


		if(BIT_B(word2))
			offset = MAKE_INT_32(REG_D[offset&7]);
		if(BIT_5(word2))
			width = REG_D[width&7];

		/* Offset is signed so we have to use ugly math =( */
		ea += offset / 8;
		offset %= 8;
		if(offset < 0)
		{
			offset += 8;
			ea--;
		}
		width = ((width-1) & 31) + 1;

		mask_base = MASK_OUT_ABOVE_32(0xffffffff << (32 - width));
		mask_long = mask_base >> offset;

		insert_base = MASK_OUT_ABOVE_32(insert_base << (32 - width));
		FLAG_N = NFLAG_32(insert_base);
		FLAG_Z = insert_base;
		insert_long = insert_base >> offset;

		data_long = m68ki_read_32(ea);
		FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;

		m68ki_write_32(ea, (data_long & ~mask_long) | insert_long);

		if((width + offset) > 32)
		{
			mask_byte = MASK_OUT_ABOVE_8(mask_base);
			insert_byte = MASK_OUT_ABOVE_8(insert_base);
			data_byte = m68ki_read_8(ea+4);
			FLAG_Z |= (data_byte & mask_byte);
			m68ki_write_8(ea+4, (data_byte & ~mask_byte) | insert_byte);
		}
		return;
	}
	m68ki_exception_illegal();
}